

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# baseline.cc
# Opt level: O0

void BASELINE::reset_baseline_disabled(example *ec)

{
  bool bVar1;
  features_value_index_iterator *this;
  long *plVar2;
  feature_value *pfVar3;
  int __c;
  features_value_iterator *rhs;
  features_value_index_iterator *f;
  iterator __end1;
  iterator __begin1;
  features *__range1;
  features *fs;
  features_value_iterator local_38 [2];
  features_value_iterator in_stack_ffffffffffffffd8;
  
  features::begin((features *)in_stack_ffffffffffffffd8._begin);
  features::end((features *)in_stack_ffffffffffffffd8._begin);
  while( true ) {
    rhs = local_38;
    bVar1 = features_value_iterator::operator!=
                      ((features_value_iterator *)&stack0xffffffffffffffd8,rhs);
    if (!bVar1) {
      return;
    }
    this = features_value_index_iterator::operator*
                     ((features_value_index_iterator *)&stack0xffffffffffffffd8);
    plVar2 = (long *)features_value_index_iterator::index(this,(char *)rhs,__c);
    if (*plVar2 == 0x54d) break;
    features_value_index_iterator::operator++(this);
  }
  pfVar3 = features_value_iterator::value(&this->super_features_value_iterator);
  *pfVar3 = 0.0;
  return;
}

Assistant:

void reset_baseline_disabled(example* ec)
{
  auto& fs = ec->feature_space[message_namespace];
  for (auto& f : fs)
  {
    if (f.index() == baseline_enabled_idx)
    {
      f.value() = 0;
      return;
    }
  }
}